

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.hh
# Opt level: O0

string * __thiscall
OB::Color::rgb_to_hex_abi_cxx11_(string *__return_storage_ptr__,Color *this,RGB rgb)

{
  ostream *poVar1;
  string local_200;
  string local_1e0;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream os;
  Color *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"#");
  hex_encode_abi_cxx11_(&local_1c0,this,(char)(int)rgb.r);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  hex_encode_abi_cxx11_(&local_1e0,this,(char)(int)rgb.g);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  hex_encode_abi_cxx11_(&local_200,this,(char)(int)rgb.b);
  std::operator<<(poVar1,(string *)&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string rgb_to_hex(RGB rgb) const
  {
    std::ostringstream os; os
    << "#"
    << hex_encode(static_cast<char>(rgb.r))
    << hex_encode(static_cast<char>(rgb.g))
    << hex_encode(static_cast<char>(rgb.b));

    return os.str();
  }